

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCodewordDecoder.cpp
# Opt level: O2

int ZXing::Pdf417::CodewordDecoder::GetCodeword(int symbol)

{
  unsigned_short *puVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((symbol & 0xffff0000U) == 0x10000) {
    puVar1 = std::__lower_bound<unsigned_short_const*,int,__gnu_cxx::__ops::_Iter_less_val>
                       (&SYMBOL_TABLE,CODEWORD_TABLE);
    if ((puVar1 != (unsigned_short *)CODEWORD_TABLE) && ((symbol & 0xffffU) == (uint)*puVar1)) {
      iVar2 = (int)(puVar1[0xae3] - 1) % 0x3a1;
    }
  }
  return iVar2;
}

Assistant:

int
CodewordDecoder::GetCodeword(int symbol)
{
	if ((symbol & 0xFFFF0000) != 0x10000)
		return -1;
	symbol &= 0xFFFF;
	auto it = std::lower_bound(SYMBOL_TABLE.begin(), SYMBOL_TABLE.end(), symbol);
	if (it != SYMBOL_TABLE.end() && *it == symbol) {
		return (CODEWORD_TABLE[it - SYMBOL_TABLE.begin()] - 1) % NUMBER_OF_CODEWORDS;
	}
	return -1;
}